

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:189:26)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:189:26)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  ParseStream *pPVar1;
  TutorialApplication *pTVar2;
  Vec3fa VVar3;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  
  pPVar1 = cin->ptr;
  if (pPVar1 != (ParseStream *)0x0) {
    (*(pPVar1->
      super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ).super_RefCount._vptr_RefCount[2])(pPVar1);
  }
  pTVar2 = (this->f).this;
  VVar3 = ParseStream::getVec3fa((ParseStream *)&local_28);
  (pTVar2->camera).up.field_0.m128[0] = local_28;
  (pTVar2->camera).up.field_0.m128[1] = fStack_24;
  (pTVar2->camera).up.field_0.m128[2] = fStack_20;
  (pTVar2->camera).up.field_0.m128[3] = fStack_1c;
  pTVar2->command_line_camera = true;
  (*(pPVar1->
    super_Stream<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>).
    super_RefCount._vptr_RefCount[3])(local_28,VVar3.field_0._8_8_,pPVar1);
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }